

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.cc
# Opt level: O3

base_learner * bs_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  uint uVar2;
  undefined4 uVar3;
  int iVar4;
  bs *location;
  option_group_definition *this;
  vector<double,_std::allocator<double>_> *this_00;
  base_learner *l;
  single_learner *__src;
  learner<bs,_example> *__dest;
  size_t sVar5;
  string type_string;
  size_type __dnew_1;
  option_group_definition new_options;
  size_type __dnew;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  long local_250;
  string local_248;
  option_group_definition local_228;
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  _func_int ***local_1d0;
  _func_int **local_1c8;
  _func_int **local_1c0 [2];
  string local_1b0;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined2 local_178;
  undefined1 local_170 [112];
  bool local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  undefined1 local_d0 [112];
  bool local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  location = calloc_or_throw<bs>(1);
  *(undefined8 *)location = 0;
  location->bs_type = 0;
  location->lb = 0.0;
  location->ub = 0.0;
  location->pred_vec = (vector<double,_std::allocator<double>_> *)0x0;
  location->all = (vw *)0x0;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  local_270.field_2._M_allocated_capacity._0_4_ = 0x6e61656d;
  local_270._M_string_length = 4;
  local_270.field_2._M_local_buf[4] = '\0';
  local_180 = 0x61727473746f6f42;
  local_178 = 0x70;
  local_188 = 9;
  local_228.m_name._M_dataplus._M_p = (pointer)&local_228.m_name.field_2;
  local_190 = &local_180;
  std::__cxx11::string::_M_construct<char*>((string *)&local_228,&local_180,(long)&local_178 + 1);
  local_228.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_248.field_2._M_allocated_capacity = 0x61727473746f6f62;
  local_248.field_2._8_2_ = 0x70;
  local_248._M_string_length = 9;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_170,&local_248,&location->B);
  local_100 = true;
  local_d0._0_8_ = (_func_int **)0x2f;
  local_1d0 = local_1c0;
  local_1d0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_1d0,(ulong)local_d0);
  local_1c0[0] = (_func_int **)local_d0._0_8_;
  builtin_strncpy((char *)((long)local_1d0 + 0x1f),"tance re",8);
  builtin_strncpy((char *)((long)local_1d0 + 0x27),"sampling",8);
  local_1d0[2] = (_func_int **)0x6e696c6e6f207962;
  local_1d0[3] = (_func_int **)0x74726f706d692065;
  *local_1d0 = (_func_int **)0x6f62207961772d6b;
  local_1d0[1] = (_func_int **)0x207061727473746f;
  local_1c8 = (_func_int **)local_d0._0_8_;
  *(char *)((long)local_1d0 + local_d0._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  this = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                   (&local_228,(typed_option<unsigned_int> *)local_170);
  local_1b0.field_2._M_allocated_capacity._0_4_ = 0x745f7362;
  local_1b0.field_2._M_allocated_capacity._4_3_ = 0x657079;
  local_1b0._M_string_length = 7;
  local_1b0.field_2._M_local_buf[7] = '\0';
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_d0,&local_1b0,&local_270);
  local_60 = true;
  local_250 = 0x1b;
  local_1f0 = local_1e0;
  local_1f0 = (long *)std::__cxx11::string::_M_create((ulong *)&local_1f0,(ulong)&local_250);
  local_1e0[0] = local_250;
  builtin_strncpy((char *)((long)local_1f0 + 0xb),"type {me",8);
  builtin_strncpy((char *)((long)local_1f0 + 0x13),"an,vote}",8);
  *local_1f0 = 0x6974636964657270;
  local_1f0[1] = 0x2065707974206e6f;
  local_1e8 = local_250;
  *(char *)((long)local_1f0 + local_250) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (this,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_d0);
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  local_d0._0_8_ = &PTR__typed_option_002dd190;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  local_170._0_8_ = &PTR__typed_option_002dd270;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_228);
  pp_Var1 = (_func_int **)(local_170 + 0x10);
  local_170._16_8_ = 0x61727473746f6f62;
  local_170._24_2_ = 0x70;
  local_170._8_8_ = (pointer)0x9;
  local_170._0_8_ = pp_Var1;
  iVar4 = (*options->_vptr_options_i[1])(options,local_170);
  if ((_func_int **)local_170._0_8_ != pp_Var1) {
    operator_delete((void *)local_170._0_8_);
  }
  if ((char)iVar4 == '\0') {
    __dest = (learner<bs,_example> *)0x0;
    goto LAB_001c51d4;
  }
  location->lb = -3.4028235e+38;
  location->ub = 3.4028235e+38;
  local_170._8_8_ = (pointer)0x7;
  local_170._16_8_ = 0x657079745f7362;
  local_170._0_8_ = pp_Var1;
  iVar4 = (*options->_vptr_options_i[1])(options);
  if ((_func_int **)local_170._0_8_ != pp_Var1) {
    operator_delete((void *)local_170._0_8_);
  }
  if ((char)iVar4 == '\0') {
LAB_001c50bf:
    sVar5 = 0;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&local_270);
    if (iVar4 == 0) goto LAB_001c50bf;
    iVar4 = std::__cxx11::string::compare((char *)&local_270);
    if (iVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "warning: bs_type must be in {\'mean\',\'vote\'}; resetting to mean.",0x3f);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      goto LAB_001c50bf;
    }
    sVar5 = 1;
  }
  location->bs_type = sVar5;
  this_00 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
  (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  location->pred_vec = this_00;
  std::vector<double,_std::allocator<double>_>::reserve(this_00,(ulong)location->B);
  location->all = all;
  l = setup_base(options,all);
  __src = LEARNER::as_singleline<char,char>(l);
  uVar2 = location->B;
  uVar3 = *(undefined4 *)(__src + 0xd0);
  __dest = calloc_or_throw<LEARNER::learner<bs,example>>(1);
  memcpy(__dest,__src,0xe9);
  *(single_learner **)(__dest + 0x20) = __src;
  *(code **)(__dest + 0x50) = LEARNER::recur_sensitivity;
  *(bs **)(__dest + 0xb8) = location;
  *(single_learner **)(__dest + 0xc0) = __src;
  *(code **)(__dest + 200) = LEARNER::noop;
  *(ulong *)(__dest + 0xd8) = (ulong)uVar2;
  *(ulong *)(__dest + 0xe0) = (ulong)uVar2 * *(long *)(__src + 0xe0);
  *(bs **)(__dest + 0x18) = location;
  *(code **)(__dest + 0x28) = predict_or_learn<true>;
  *(code **)(__dest + 0x38) = predict_or_learn<true>;
  *(code **)(__dest + 0x30) = predict_or_learn<false>;
  *(undefined8 *)(__dest + 0x40) = 0;
  *(undefined4 *)(__dest + 0xd0) = uVar3;
  __dest[0xe8] = (learner<bs,_example>)0x0;
  *(bs **)(__dest + 0x58) = location;
  *(code **)(__dest + 0x68) = finish_example;
  *(bs **)(__dest + 0xb8) = location;
  *(single_learner **)(__dest + 0xc0) = __src;
  *(code **)(__dest + 200) = finish;
  location = (bs *)0x0;
LAB_001c51d4:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_228.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.m_name._M_dataplus._M_p != &local_228.m_name.field_2) {
    operator_delete(local_228.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if (location != (bs *)0x0) {
    free(location);
  }
  return (base_learner *)__dest;
}

Assistant:

base_learner* bs_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<bs>();
  std::string type_string("mean");
  option_group_definition new_options("Bootstrap");
  new_options.add(make_option("bootstrap", data->B).keep().help("k-way bootstrap by online importance resampling"))
      .add(make_option("bs_type", type_string).keep().help("prediction type {mean,vote}"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("bootstrap"))
    return nullptr;

  data->ub = FLT_MAX;
  data->lb = -FLT_MAX;

  if (options.was_supplied("bs_type"))
  {
    if (type_string.compare("mean") == 0)
      data->bs_type = BS_TYPE_MEAN;
    else if (type_string.compare("vote") == 0)
      data->bs_type = BS_TYPE_VOTE;
    else
    {
      std::cerr << "warning: bs_type must be in {'mean','vote'}; resetting to mean." << std::endl;
      data->bs_type = BS_TYPE_MEAN;
    }
  }
  else  // by default use mean
    data->bs_type = BS_TYPE_MEAN;

  data->pred_vec = new vector<double>();
  data->pred_vec->reserve(data->B);
  data->all = &all;

  learner<bs, example>& l = init_learner(
      data, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>, data->B);
  l.set_finish_example(finish_example);
  l.set_finish(finish);

  return make_base(l);
}